

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::
     PrintTo<std::unordered_set<int,std::hash<int>,std::equal_to<int>,std::allocator<int>>>
               (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *value,
               ostream *os)

{
  IsContainer IVar1;
  ostream *os_local;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *value_local;
  
  IVar1 = IsContainerTest<std::unordered_set<int,std::hash<int>,std::equal_to<int>,std::allocator<int>>>
                    (0,(iterator *)0x0,(const_iterator *)0x0);
  DefaultPrintTo<std::unordered_set<int,std::hash<int>,std::equal_to<int>,std::allocator<int>>>
            (IVar1,value,os);
  return;
}

Assistant:

void PrintTo(const T& value, ::std::ostream* os) {
  // DefaultPrintTo() is overloaded.  The type of its first two
  // arguments determine which version will be picked.  If T is an
  // STL-style container, the version for container will be called; if
  // T is a pointer, the pointer version will be called; otherwise the
  // generic version will be called.
  //
  // Note that we check for container types here, prior to we check
  // for protocol message types in our operator<<.  The rationale is:
  //
  // For protocol messages, we want to give people a chance to
  // override Google Mock's format by defining a PrintTo() or
  // operator<<.  For STL containers, other formats can be
  // incompatible with Google Mock's format for the container
  // elements; therefore we check for container types here to ensure
  // that our format is used.
  //
  // The second argument of DefaultPrintTo() is needed to bypass a bug
  // in Symbian's C++ compiler that prevents it from picking the right
  // overload between:
  //
  //   PrintTo(const T& x, ...);
  //   PrintTo(T* x, ...);
  DefaultPrintTo(IsContainerTest<T>(0), is_pointer<T>(), value, os);
}